

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonBuilder.cpp
# Opt level: O2

int __thiscall
helics::fileops::JsonMapBuilder::generatePlaceHolder
          (JsonMapBuilder *this,string *location,int32_t code)

{
  int index;
  int local_4c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_48;
  
  local_4c = (int)(this->missing_components)._M_t._M_impl.super__Rb_tree_header._M_node_count + 2;
  std::__cxx11::string::string
            ((string *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)location);
  local_48.second = code;
  std::
  _Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
  ::_M_emplace_unique<int&,std::pair<std::__cxx11::string,int>>
            ((_Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
              *)&this->missing_components,&local_4c,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return local_4c;
}

Assistant:

int JsonMapBuilder::generatePlaceHolder(const std::string& location, int32_t code)
{
    int index = static_cast<int>(missing_components.size()) + 2;
    missing_components.emplace(index, std::make_pair(location, code));
    return index;
}